

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostCoordinator.hpp
# Opt level: O1

void __thiscall
memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>::
copy<memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>
          (HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>> *this,
          ArrayView<value_type,_HostCoordinator<value_type,_Allocator<float,_AlignedPolicy<16UL>_>_>_>
          *from,ArrayView<value_type,_HostCoordinator<value_type,_Allocator<float,_AlignedPolicy<32UL>_>_>_>
                *to)

{
  size_type sVar1;
  pointer __src;
  pointer __dest;
  
  sVar1 = from->size_;
  if (sVar1 != to->size_) {
    __assert_fail("from.size()==to.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/HostCoordinator.hpp"
                  ,0x65,
                  "void memory::HostCoordinator<float, memory::Allocator<float, memory::impl::AlignedPolicy<32>>>::copy(const ArrayView<value_type, HostCoordinator<value_type, Allocator1>> &, ArrayView<value_type, HostCoordinator<value_type, Allocator2>> &) [T = float, Allocator = memory::Allocator<float, memory::impl::AlignedPolicy<32>>, Allocator1 = memory::Allocator<float, memory::impl::AlignedPolicy<16>>, Allocator2 = memory::Allocator<float, memory::impl::AlignedPolicy<32>>]"
                 );
  }
  __src = from->pointer_;
  __dest = to->pointer_;
  if (__src + sVar1 <= __dest || __dest + to->size_ <= __src) {
    if (sVar1 != 0) {
      memmove(__dest,__src,sVar1 << 2);
      return;
    }
    return;
  }
  __assert_fail("!from.overlaps(to)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/HostCoordinator.hpp"
                ,0x66,
                "void memory::HostCoordinator<float, memory::Allocator<float, memory::impl::AlignedPolicy<32>>>::copy(const ArrayView<value_type, HostCoordinator<value_type, Allocator1>> &, ArrayView<value_type, HostCoordinator<value_type, Allocator2>> &) [T = float, Allocator = memory::Allocator<float, memory::impl::AlignedPolicy<32>>, Allocator1 = memory::Allocator<float, memory::impl::AlignedPolicy<16>>, Allocator2 = memory::Allocator<float, memory::impl::AlignedPolicy<32>>]"
               );
}

Assistant:

void copy(const ArrayView<value_type, HostCoordinator<value_type, Allocator1>>& from,
                    ArrayView<value_type, HostCoordinator<value_type, Allocator2>>& to)
    {
        assert(from.size()==to.size());
        assert(!from.overlaps(to));

        #ifdef VERBOSE
        using c1 = HostCoordinator<value_type, Allocator1>;
        std::cerr << util::type_printer<c1>::print()
                  << "::" + util::blue("copy") << "(" << from.size()
                  << " [" << from.size()*sizeof(value_type) << " bytes])"
                  << " " << from.data() << util::yellow(" -> ") << to.data()
                  << std::endl;
        #endif

        std::copy(from.begin(), from.end(), to.begin());
    }